

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

int __thiscall Matrix::nSize(Matrix *this,int n)

{
  int iVar1;
  ostream *poVar2;
  
  if (n < this->nMatrixDimension) {
    iVar1 = this->pSize[n];
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Matrix::nSize(int): int (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
    poVar2 = std::operator<<(poVar2,") larger than number of dimensions.");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Matrix::nSize(int n)
{
	if( n>=nMatrixDimension ) {
		cout << "Matrix::nSize(int): int ("
			<< n
			<< ") larger than number of dimensions." << endl;
		return -1;
	}
	return pSize[n];
}